

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test1.cpp
# Opt level: O0

void affineMatrixTest1(void)

{
  ostream *poVar1;
  void *pvVar2;
  float *in_R8;
  float fVar3;
  Matrix<float,_3UL,_3UL> local_2d0;
  float local_2ac;
  Matrix<float,_3UL,_3UL> local_2a8;
  undefined1 local_284 [68];
  AffineMatrix4T<float> local_240;
  AffineMatrix4T<float> local_210;
  AffineMatrix4T<float> local_1e0;
  TransposedType local_1b0;
  float local_170;
  float local_16c;
  float local_168;
  float local_164;
  Vector<float,_3UL> local_160;
  Vector<float,_3UL> local_154;
  undefined1 local_148 [8];
  Matrix4 A2;
  initializer_list<float> local_d8;
  undefined1 local_c8 [8];
  AffineMatrix4 B;
  initializer_list<float> local_58;
  undefined1 local_48 [8];
  Matrix4 A;
  
  memcpy(B.m_ + 10,&DAT_001171d0,0x40);
  local_58._M_array = B.m_ + 10;
  local_58._M_len = 0x10;
  Gs::Matrix<float,_4UL,_4UL>::Matrix((Matrix<float,_4UL,_4UL> *)local_48,&local_58);
  memcpy(A2.m_ + 0xe,&DAT_00117210,0x30);
  local_d8._M_array = A2.m_ + 0xe;
  local_d8._M_len = 0xc;
  Gs::AffineMatrix4T<float>::AffineMatrix4T((AffineMatrix4T<float> *)local_c8,&local_d8);
  Gs::Matrix<float,_4UL,_4UL>::Matrix((Matrix<float,_4UL,_4UL> *)local_148,(ThisType *)local_48);
  local_164 = 1.0;
  local_168 = 1.0;
  local_16c = 1.0;
  Gs::Vector<float,_3UL>::Vector(&local_160,&local_164,&local_168,&local_16c);
  Gs::Vector<float,_3UL>::Normalized(&local_154);
  local_170 = 1.5707964;
  Gs::RotateFree<Gs::Matrix<float,4ul,4ul>,float>
            ((Matrix<float,_4UL,_4UL> *)local_148,&local_154,&local_170);
  poVar1 = std::operator<<((ostream *)&std::cout,"A = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = Gs::operator<<(poVar1,(Matrix<float,_4UL,_4UL> *)local_48);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"B = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = Gs::operator<<(poVar1,(AffineMatrix4T<float> *)local_c8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"B^T = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Gs::AffineMatrix4T<float>::Transposed(&local_1b0,(AffineMatrix4T<float> *)local_c8);
  poVar1 = Gs::operator<<(poVar1,&local_1b0);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Inv(B) = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Gs::AffineMatrix4T<float>::Inverse(&local_1e0,(AffineMatrix4T<float> *)local_c8);
  poVar1 = Gs::operator<<(poVar1,&local_1e0);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"B*Inv(B) = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Gs::AffineMatrix4T<float>::Inverse(&local_240,(AffineMatrix4T<float> *)local_c8);
  Gs::operator*(&local_210,(AffineMatrix4T<float> *)local_c8,&local_240);
  poVar1 = Gs::operator<<(poVar1,&local_210);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"| A | = ");
  fVar3 = Gs::Matrix<float,_4UL,_4UL>::Determinant((Matrix<float,_4UL,_4UL> *)local_48);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,fVar3);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"| B | = ");
  fVar3 = Gs::AffineMatrix4T<float>::Determinant((AffineMatrix4T<float> *)local_c8);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,fVar3);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Trace A = ");
  fVar3 = Gs::Matrix<float,_4UL,_4UL>::Trace((Matrix<float,_4UL,_4UL> *)local_48);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,fVar3);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Trace B = ");
  fVar3 = Gs::AffineMatrix4T<float>::Trace((AffineMatrix4T<float> *)local_c8);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,fVar3);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"A1 = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = Gs::operator<<(poVar1,(Matrix<float,_4UL,_4UL> *)local_48);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"A2 = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = Gs::operator<<(poVar1,(Matrix<float,_4UL,_4UL> *)local_148);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"Lerp(A1, A2, 0.5) = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_284._0_4_ = 0.5;
  Gs::Lerp<Gs::Matrix<float,4ul,4ul>,float>
            ((Matrix<float,_4UL,_4UL> *)(local_284 + 4),(Gs *)local_48,
             (Matrix<float,_4UL,_4UL> *)local_148,(Matrix<float,_4UL,_4UL> *)local_284,in_R8);
  poVar1 = Gs::operator<<(poVar1,(Matrix<float,_4UL,_4UL> *)(local_284 + 4));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"5 * I3 = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_2ac = 5.0;
  Gs::Matrix<float,_3UL,_3UL>::Identity();
  Gs::operator*(&local_2a8,&local_2ac,&local_2d0);
  poVar1 = Gs::operator<<(poVar1,&local_2a8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void affineMatrixTest1()
{
    Matrix4 A
    {
        1, 0, -2, 6,
        0, 8, 0, -4,
        0, 1, 2, 0,
        0, 0, 0, 1
    };

    AffineMatrix4 B
    {
        1, 0, -2, 6,
        0, 8, 0, -4,
        0, 1, 2, 0
    };

    auto A2 = A;
    RotateFree(A2, Vector3(1, 1, 1).Normalized(), pi*0.5f);
    //B.MakeInverse();

    std::cout << "A = " << std::endl << A << std::endl;
    #if GS_ENABLE_INVERSE_OPERATOR
    std::cout << "Inv(A) = " << std::endl << (A^-1) << std::endl;
    std::cout << "A*Inv(A) = " << std::endl << A*(A^-1) << std::endl;
    #endif
    std::cout << "B = " << std::endl << B << std::endl;
    std::cout << "B^T = " << std::endl << B.Transposed() << std::endl;
    std::cout << "Inv(B) = " << std::endl << B.Inverse() << std::endl;
    std::cout << "B*Inv(B) = " << std::endl << B*B.Inverse() << std::endl;
    std::cout << "| A | = " << A.Determinant() << std::endl;
    std::cout << "| B | = " << B.Determinant() << std::endl;
    std::cout << "Trace A = " << A.Trace() << std::endl;
    std::cout << "Trace B = " << B.Trace() << std::endl;
    std::cout << std::endl << "A1 = " << std::endl << A << std::endl;
    std::cout << std::endl << "A2 = " << std::endl << A2 << std::endl;
    std::cout << std::endl << "Lerp(A1, A2, 0.5) = " << std::endl << Lerp(A, A2, 0.5f) << std::endl;
    std::cout << std::endl << "5 * I3 = " << std::endl << Real(5) * Matrix3::Identity() << std::endl;
}